

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

void __thiscall libtorrent::aux::socks5::handshake4(socks5 *this,error_code *e)

{
  bool bVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  int status;
  int version;
  char *p;
  error_code *local_18;
  error_code *e_local;
  socks5 *this_local;
  
  if ((this->m_abort & 1U) == 0) {
    local_18 = e;
    e_local = (error_code *)this;
    bVar1 = boost::system::error_code::operator_cast_to_bool(e);
    if (bVar1) {
      bVar1 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
      if (bVar1) {
        p._7_1_ = 0x28;
        alert_manager::
        emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code_const&>
                  (this->m_alerts,&this->m_proxy_addr,(operation_t *)((long)&p + 7),local_18);
      }
      this->m_failures = this->m_failures + 1;
      retry_connection(this);
    }
    else {
      _status = ::std::array<char,_270UL>::data(&this->m_tmp_buf);
      uVar2 = read_uint8<char*>((char **)&status);
      uVar3 = read_uint8<char*>((char **)&status);
      if ((uVar2 == '\x01') && (uVar3 == '\0')) {
        socks_forward_udp(this);
      }
    }
  }
  return;
}

Assistant:

void socks5::handshake4(error_code const& e)
{
	COMPLETE_ASYNC("socks5::on_handshake4");
	if (m_abort) return;
	if (e)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake, e);
		++m_failures;
		retry_connection();
		return;
	}

	using namespace libtorrent::aux;

	char* p = m_tmp_buf.data();
	int const version = read_uint8(p);
	int const status = read_uint8(p);

	if (version != 1 || status != 0) return;

	socks_forward_udp(/*l*/);
}